

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

int match(c2m_ctx_t c2m_ctx,int c,pos_t *pos,node_code_t *node_code,node_t_conflict *node)

{
  parse_ctx *ppVar1;
  token_t ptVar2;
  int iVar3;
  int iVar4;
  
  ppVar1 = c2m_ctx->parse_ctx;
  iVar4 = 0;
  ptVar2 = ppVar1->curr_token;
  if (*(short *)ptVar2 == c) {
    if (pos != (pos_t *)0x0) {
      iVar4 = (ptVar2->pos).lno;
      iVar3 = (ptVar2->pos).ln_pos;
      pos->fname = (ptVar2->pos).fname;
      pos->lno = iVar4;
      pos->ln_pos = iVar3;
    }
    if (node_code != (node_code_t *)0x0) {
      *node_code = ppVar1->curr_token->node_code;
    }
    if (node != (node_t_conflict *)0x0) {
      *node = ppVar1->curr_token->node;
    }
    read_token(c2m_ctx);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int match (c2m_ctx_t c2m_ctx, int c, pos_t *pos, node_code_t *node_code, node_t *node) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;

  if (curr_token->code != c) return FALSE;
  if (pos != NULL) *pos = curr_token->pos;
  if (node_code != NULL) *node_code = curr_token->node_code;
  if (node != NULL) *node = curr_token->node;
  read_token (c2m_ctx);
  return TRUE;
}